

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_annotator.cpp
# Opt level: O3

map<unsigned_long,_flatbuffers::BinarySection,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
* __thiscall
flatbuffers::BinaryAnnotator::Annotate
          (map<unsigned_long,_flatbuffers::BinarySection,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
           *__return_storage_ptr__,BinaryAnnotator *this)

{
  _Rb_tree_header *p_Var1;
  uint *puVar2;
  ulong uVar3;
  bool bVar4;
  uint64_t table_offset;
  Object *table;
  Verifier verifier;
  VerifierTemplate<false> local_68;
  
  puVar2 = (uint *)this->bfbs_;
  if ((puVar2 != (uint *)0x0) && (uVar3 = this->bfbs_length_, uVar3 != 0)) {
    local_68.opts_.max_depth = 0x40;
    local_68.opts_.max_tables = 1000000;
    local_68.opts_.check_alignment = true;
    local_68.opts_.check_nested_flatbuffers = true;
    local_68.opts_.max_size = 0x7fffffff;
    local_68.opts_.assert = false;
    local_68.upper_bound_ = 0;
    local_68.depth_ = 0;
    local_68.num_tables_ = 0;
    local_68.flex_reuse_tracker_ = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
    local_68.buf_ = (uint8_t *)puVar2;
    local_68.size_ = uVar3;
    if (0x7ffffffe < uVar3) {
      __assert_fail("size_ < opts.max_size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/verifier.h"
                    ,0x2f,
                    "flatbuffers::VerifierTemplate<false>::VerifierTemplate(const uint8_t *const, const size_t, const Options &) [TrackVerifierBufferSize = false]"
                   );
    }
    if (((this->is_size_prefixed_ == true) &&
        (((uVar3 < 5 || (uVar3 < (ulong)*puVar2 + 4)) ||
         (bVar4 = VerifierTemplate<false>::VerifyBufferFromStart<reflection::Schema>
                            (&local_68,"BFBS",4), !bVar4)))) ||
       (bVar4 = VerifierTemplate<false>::VerifyBufferFromStart<reflection::Schema>
                          (&local_68,"BFBS",0), !bVar4)) goto LAB_0030296e;
  }
  if (0xb < this->binary_length_) {
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::list<flatbuffers::BinaryAnnotator::VTable,_std::allocator<flatbuffers::BinaryAnnotator::VTable>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::list<flatbuffers::BinaryAnnotator::VTable,_std::allocator<flatbuffers::BinaryAnnotator::VTable>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<flatbuffers::BinaryAnnotator::VTable,_std::allocator<flatbuffers::BinaryAnnotator::VTable>_>_>_>_>
    ::clear(&(this->vtables_)._M_t);
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_flatbuffers::BinarySection>,_std::_Select1st<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
    ::clear(&(this->sections_)._M_t);
    table_offset = BuildHeader(this,0);
    if (table_offset < this->binary_length_) {
      table = RootTable(this);
      BuildTable(this,table_offset,RootTable,table);
    }
    FixMissingRegions(this);
    FixMissingSections(this);
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_flatbuffers::BinarySection>,_std::_Select1st<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
    ::_Rb_tree(&__return_storage_ptr__->_M_t,&(this->sections_)._M_t);
    return __return_storage_ptr__;
  }
LAB_0030296e:
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl = 0;
  *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  return __return_storage_ptr__;
}

Assistant:

std::map<uint64_t, BinarySection> BinaryAnnotator::Annotate() {
  if (bfbs_ != nullptr && bfbs_length_ != 0) {
    flatbuffers::Verifier verifier(bfbs_, static_cast<size_t>(bfbs_length_));
    if ((is_size_prefixed_ &&
         !reflection::VerifySizePrefixedSchemaBuffer(verifier)) ||
        !reflection::VerifySchemaBuffer(verifier)) {
      return {};
    }
  }

  // The binary is too short to read as a flatbuffers.
  if (binary_length_ < FLATBUFFERS_MIN_BUFFER_SIZE) { return {}; }

  // Make sure we start with a clean slate.
  vtables_.clear();
  sections_.clear();

  // First parse the header region which always start at offset 0.
  // The returned offset will point to the root_table location.
  const uint64_t root_table_offset = BuildHeader(0);

  if (IsValidOffset(root_table_offset)) {
    // Build the root table, and all else will be referenced from it.
    BuildTable(root_table_offset, BinarySectionType::RootTable, RootTable());
  }

  // Now that all the sections are built, make sure the binary sections are
  // contiguous.
  FixMissingRegions();

  // Then scan the area between BinarySections insert padding sections that are
  // implied.
  FixMissingSections();

  return sections_;
}